

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::detail::Dispatch_Engine::add_global_no_throw
          (Dispatch_Engine *this,Boxed_Value *obj,string *name)

{
  pointer ppVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_Boxed_Value>_>::value,_pair<iterator,_bool>_>
  _Var2;
  Boxed_Value BVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
  local_78;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>
  local_48;
  undefined1 local_40;
  undefined1 local_38 [8];
  unique_lock<chaiscript::detail::threading::shared_mutex> l;
  string *name_local;
  Boxed_Value *obj_local;
  Dispatch_Engine *this_local;
  
  std::unique_lock<std::shared_mutex>::unique_lock
            ((unique_lock<std::shared_mutex> *)local_38,(mutex_type *)obj);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_true>
            (&local_78,in_RCX,(Boxed_Value *)name);
  _Var2 = std::
          map<std::__cxx11::string,chaiscript::Boxed_Value,chaiscript::str_less,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>
          ::insert<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>>
                    ((map<std::__cxx11::string,chaiscript::Boxed_Value,chaiscript::str_less,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>
                      *)(obj + 0x16),&local_78);
  local_48 = _Var2.first._M_node;
  local_40 = _Var2.second;
  ppVar1 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>
           ::operator->(&local_48);
  Boxed_Value::Boxed_Value((Boxed_Value *)this,&ppVar1->second);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
  ::~pair(&local_78);
  std::unique_lock<std::shared_mutex>::~unique_lock((unique_lock<std::shared_mutex> *)local_38);
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value add_global_no_throw(Boxed_Value obj, std::string name) {
        chaiscript::detail::threading::unique_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);

        return m_state.m_global_objects.insert(std::pair{std::move(name), std::move(obj)}).first->second;
      }